

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall WorldShuffler::place_fixed_items(WorldShuffler *this)

{
  ItemSource *pIVar1;
  Item *pIVar2;
  string *source_name;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_141;
  allocator<char> local_140;
  allocator<char> local_13f;
  allocator<char> local_13e;
  allocator<char> local_13d;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  SHOPS_TO_FILL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (this->_options->_ensure_ekeeke_in_shops == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"Massan: Shop item #1",&local_139);
    std::__cxx11::string::string<std::allocator<char>>(local_100,"Gumi: Inn item #1",&local_13a);
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"Ryuma: Inn item",&local_13b);
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"Mercator: Shop item #1",&local_13c)
    ;
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"Verla: Shop item #1",&local_13d);
    std::__cxx11::string::string<std::allocator<char>>(local_80,"Destel: Inn item",&local_13e);
    std::__cxx11::string::string<std::allocator<char>>
              (local_60,"Route to Lake Shrine: Greedly\'s shop item #1",&local_13f);
    std::__cxx11::string::string<std::allocator<char>>(local_40,"Kazalt: Shop item #1",&local_140);
    __l._M_len = 8;
    __l._M_array = &local_120;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&SHOPS_TO_FILL,__l,&local_141);
    lVar3 = 0xe0;
    do {
      std::__cxx11::string::~string((string *)((long)&local_120._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
    for (; SHOPS_TO_FILL.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           SHOPS_TO_FILL.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        SHOPS_TO_FILL.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             SHOPS_TO_FILL.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      pIVar1 = RandomizerWorld::item_source
                         (this->_world,
                          SHOPS_TO_FILL.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      pIVar2 = World::item(&this->_world->super_World,'\0');
      (*pIVar1->_vptr_ItemSource[3])(pIVar1,pIVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&SHOPS_TO_FILL);
  }
  return;
}

Assistant:

void WorldShuffler::place_fixed_items()
{
    if(_options.ensure_ekeeke_in_shops())
    {
        const std::vector<std::string> SHOPS_TO_FILL = {
                "Massan: Shop item #1",
                "Gumi: Inn item #1",
                "Ryuma: Inn item",
                "Mercator: Shop item #1",
                "Verla: Shop item #1",
                "Destel: Inn item",
                "Route to Lake Shrine: Greedly's shop item #1",
                "Kazalt: Shop item #1"
        };
        for(const std::string& source_name : SHOPS_TO_FILL)
            _world.item_source(source_name)->item(_world.item(ITEM_EKEEKE));
    }
}